

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

ssize_t __thiscall
Fl_Preferences::RootNode::read(RootNode *this,int __fd,void *__buf,size_t __nbytes)

{
  char *__s;
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  Node *this_00;
  char buf [1024];
  
  if ((this->filename_ != (char *)0x0) &&
     (__stream = (FILE *)fl_fopen(this->filename_,"rb"), __stream != (FILE *)0x0)) {
    fgets(buf,0x400,__stream);
    fgets(buf,0x400,__stream);
    fgets(buf,0x400,__stream);
    this_00 = this->prefs_->node;
    __s = buf + 1;
    while (pcVar1 = fgets(buf,0x400,__stream), pcVar1 != (char *)0x0) {
      if (buf[0] == '+') {
        sVar2 = strcspn(__s,"\n\r");
        if (sVar2 != 0) {
          buf[sVar2 + 1] = '\0';
          Node::add(this_00,__s);
        }
      }
      else if (buf[0] == '[') {
        sVar2 = strcspn(__s,"]\n\r");
        buf[sVar2 + 1] = '\0';
        this_00 = Node::find(this->prefs_->node,__s);
      }
      else {
        sVar2 = strcspn(buf,"\n\r");
        if (sVar2 != 0) {
          buf[sVar2] = '\0';
          Node::set(this_00,buf);
        }
      }
    }
    fclose(__stream);
    return 0;
  }
  return -1;
}

Assistant:

int Fl_Preferences::RootNode::read() {
  if (!filename_)   // RUNTIME preferences
    return -1; 
  char buf[1024];
  FILE *f = fl_fopen( filename_, "rb" );
  if ( !f )
    return -1; 
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  Node *nd = prefs_->node;
  for (;;) {
    if ( !fgets( buf, 1024, f ) ) break;	// EOF or Error
    if ( buf[0]=='[' ) {			// read a new group
      size_t end = strcspn( buf+1, "]\n\r" );
      buf[ end+1 ] = 0;
      nd = prefs_->node->find( buf+1 );
    } else if ( buf[0]=='+' ) {			// value of previous name/value pair spans multiple lines
      size_t end = strcspn( buf+1, "\n\r" );
      if ( end != 0 ) {				// if entry is not empty
	buf[ end+1 ] = 0;
	nd->add( buf+1 );
      }
    } else {					 // read a name/value pair
      size_t end = strcspn( buf, "\n\r" );
      if ( end != 0 ) {				// if entry is not empty
	buf[ end ] = 0;
	nd->set( buf );
      }
    }
  }
  fclose( f );
  return 0;
}